

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  uint8 *__dest;
  size_t __n;
  
  __dest = WriteVarint32ToArray((uint32)str->_M_string_length,target);
  __n = (size_t)(int)str->_M_string_length;
  memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  return __dest + __n;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}